

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextSpecsOf.hpp
# Opt level: O1

void __thiscall sciplot::TextSpecs::~TextSpecs(TextSpecs *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)
   &(this->super_TextSpecsOf<sciplot::TextSpecs>).super_FontSpecsOf<sciplot::TextSpecs> =
       &PTR__TextSpecsOf_001a7a48;
  pcVar2 = (this->super_TextSpecsOf<sciplot::TextSpecs>).m_enhanced._M_dataplus._M_p;
  paVar1 = &(this->super_TextSpecsOf<sciplot::TextSpecs>).m_enhanced.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_TextSpecsOf<sciplot::TextSpecs>).m_color._M_dataplus._M_p;
  paVar1 = &(this->super_TextSpecsOf<sciplot::TextSpecs>).m_color.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  *(undefined ***)
   &(this->super_TextSpecsOf<sciplot::TextSpecs>).super_FontSpecsOf<sciplot::TextSpecs> =
       &PTR__FontSpecsOf_001a7ad8;
  pcVar2 = (this->super_TextSpecsOf<sciplot::TextSpecs>).super_FontSpecsOf<sciplot::TextSpecs>.
           m_fontsize._M_dataplus._M_p;
  paVar1 = &(this->super_TextSpecsOf<sciplot::TextSpecs>).super_FontSpecsOf<sciplot::TextSpecs>.
            m_fontsize.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_TextSpecsOf<sciplot::TextSpecs>).super_FontSpecsOf<sciplot::TextSpecs>.
           m_fontname._M_dataplus._M_p;
  paVar1 = &(this->super_TextSpecsOf<sciplot::TextSpecs>).super_FontSpecsOf<sciplot::TextSpecs>.
            m_fontname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x88);
  return;
}

Assistant:

TextSpecsOf<DerivedSpecs>::TextSpecsOf()
{
    enhanced(true);
    textColor(internal::DEFAULT_TEXTCOLOR);
}